

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::NegativeTestQuoteMeta(string *unquoted,string *should_not_match,Options *options)

{
  bool bVar1;
  ostream *poVar2;
  string quoted;
  RE2 re;
  string local_2a8;
  LogMessageFatal local_288;
  RE2 local_108;
  
  local_288.super_LogMessage._0_8_ = (unquoted->_M_dataplus)._M_p;
  local_288.super_LogMessage._8_4_ = SUB84(unquoted->_M_string_length,0);
  RE2::QuoteMeta_abi_cxx11_(&local_2a8,(RE2 *)&local_288,(StringPiece *)options);
  local_288.super_LogMessage._0_8_ = local_2a8._M_dataplus._M_p;
  local_288.super_LogMessage._8_4_ = (int)local_2a8._M_string_length;
  RE2::RE2(&local_108,(StringPiece *)&local_288,options);
  local_288.super_LogMessage._0_8_ = (should_not_match->_M_dataplus)._M_p;
  local_288.super_LogMessage._8_4_ = SUB84(should_not_match->_M_string_length,0);
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_288,&local_108);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,399);
    poVar2 = std::operator<<((ostream *)&local_288.super_LogMessage.str_,
                             "Check failed: !(RE2::FullMatch(should_not_match, re))");
    poVar2 = std::operator<<(poVar2,"Unquoted=\'");
    poVar2 = std::operator<<(poVar2,(string *)unquoted);
    poVar2 = std::operator<<(poVar2,"\', quoted=\'");
    poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
    std::operator<<(poVar2,"\'.");
    LogMessageFatal::~LogMessageFatal(&local_288);
  }
  RE2::~RE2(&local_108);
  std::__cxx11::string::~string((string *)&local_2a8);
  return;
}

Assistant:

static void NegativeTestQuoteMeta(string unquoted, string should_not_match,
                                  const RE2::Options& options = RE2::DefaultOptions) {
  string quoted = RE2::QuoteMeta(unquoted);
  RE2 re(quoted, options);
  EXPECT_FALSE(RE2::FullMatch(should_not_match, re))
      << "Unquoted='" << unquoted << "', quoted='" << quoted << "'.";
}